

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Abc_NtkPerformMfs3(Abc_Ntk_t *pNtk,Sfm_Par_t *pPars)

{
  Vec_Wrd_t *p;
  int iVar1;
  long *plVar2;
  Sfm_Dec_t *p_00;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  word wVar5;
  Vec_Ptr_t *p_01;
  word Fill;
  word Fill_00;
  int iVar6;
  Mio_Library_t *pLib;
  char *pcVar7;
  
  pLib = (Mio_Library_t *)pNtk->pManFunc;
  p_00 = Sfm_DecStart(pPars,pLib,pNtk);
  iVar6 = (int)pLib;
  if (pPars->fVerbose == 0) goto LAB_00407337;
  printf("Remapping parameters: ");
  if (pPars->nTfoLevMax != 0) {
    printf("TFO = %d. ");
  }
  if (pPars->nTfiLevMax != 0) {
    printf("TFI = %d. ");
  }
  if (pPars->nFanoutMax != 0) {
    printf("FanMax = %d. ");
  }
  if (pPars->nWinSizeMax != 0) {
    printf("WinMax = %d. ");
  }
  if (pPars->nBTLimit != 0) {
    printf("Confl = %d. ");
  }
  if ((pPars->nMffcMin != 0) && (pPars->fArea != 0)) {
    printf("MffcMin = %d. ");
  }
  if ((pPars->nMffcMax != 0) && (pPars->fArea != 0)) {
    printf("MffcMax = %d. ");
  }
  if (pPars->nDecMax != 0) {
    printf("DecMax = %d. ");
  }
  if (pPars->iNodeOne != 0) {
    printf("Pivot = %d. ");
  }
  if (pPars->fArea == 0) {
    printf("Win = %d. ",(ulong)(uint)pPars->nTimeWin);
    if (pPars->fArea != 0) goto LAB_004072c8;
    printf("Delta = %.2f ps. ",(double)p_00->DeltaCrit * 0.001);
    if (pPars->fArea != 0) goto LAB_004072c8;
  }
  else {
LAB_004072c8:
    pcVar7 = "yes";
    if (pPars->fZeroCost == 0) {
      pcVar7 = "no";
    }
    printf("0-cost = %s. ",pcVar7);
  }
  iVar6 = 0x67ef4c;
  pcVar7 = "yes";
  if (pPars->fMoreEffort == 0) {
    pcVar7 = "no";
  }
  printf("Effort = %s. ",pcVar7);
  if (pPars->fUseSim == 0) {
    iVar6 = 0x67ef50;
  }
  printf("Sim = %s. ");
  putchar(10);
LAB_00407337:
  Abc_NtkLevel(pNtk);
  if (p_00->pPars->fUseSim != 0) {
    pAVar3 = Abc_NtkPi(pNtk,iVar6);
    plVar2 = (long *)pAVar3->pNtk->pData;
    p = (Vec_Wrd_t *)(plVar2 + 0x28);
    Vec_WrdFill(p,pNtk->vObjs->nSize * 2,Fill);
    Vec_WrdFill((Vec_Wrd_t *)(plVar2 + 0x2a),pNtk->vObjs->nSize * 2,Fill_00);
    Gia_ManRandomW(1);
    if (*(int *)(*plVar2 + 0x58) == 0) {
      __assert_fail("p->pPars->fUseSim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                    ,0x14c,"void Sfm_NtkSimulate(Abc_Ntk_t *)");
    }
    for (iVar6 = 0; iVar6 < pNtk->vCis->nSize; iVar6 = iVar6 + 1) {
      pvVar4 = Vec_PtrEntry(pNtk->vCis,iVar6);
      iVar1 = *(int *)((long)pvVar4 + 0x10);
      wVar5 = Gia_ManRandomW(0);
      Vec_WrdWriteEntry(p,iVar1,wVar5);
    }
    p_01 = Abc_NtkDfs(pNtk,1);
    for (iVar6 = 0; iVar6 < p_01->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p_01,iVar6);
      iVar1 = pAVar3->Id;
      wVar5 = Sfm_ObjSimulate(pAVar3);
      Vec_WrdWriteEntry(p,iVar1,wVar5);
    }
    Vec_PtrFree(p_01);
  }
  if (pPars->fVerbose != 0) {
    p_00->nTotalNodesBeg = pNtk->nObjCounts[7];
    iVar6 = Abc_NtkGetTotalFanins(pNtk);
    p_00->nTotalEdgesBeg = iVar6;
  }
  if (pPars->fArea == 0) {
    Abc_NtkDelayOpt(p_00);
  }
  else if (pPars->fAreaRev == 0) {
    Abc_NtkAreaOpt(p_00);
  }
  else {
    Abc_NtkAreaOpt2(p_00);
  }
  if (pPars->fVerbose != 0) {
    p_00->nTotalNodesEnd = pNtk->nObjCounts[7];
    iVar6 = Abc_NtkGetTotalFanins(pNtk);
    p_00->nTotalEdgesEnd = iVar6;
    if (pPars->fVerbose != 0) {
      Sfm_DecPrintStats(p_00);
    }
  }
  if (pPars->fLibVerbose != 0) {
    Sfm_LibPrint(p_00->pLib);
  }
  Sfm_DecStop(p_00);
  return;
}

Assistant:

void Abc_NtkPerformMfs3( Abc_Ntk_t * pNtk, Sfm_Par_t * pPars )
{
    Sfm_Dec_t * p = Sfm_DecStart( pPars, (Mio_Library_t *)pNtk->pManFunc, pNtk );
    if ( pPars->fVerbose )
    {
        printf( "Remapping parameters: " );
        if ( pPars->nTfoLevMax )
            printf( "TFO = %d. ",     pPars->nTfoLevMax );
        if ( pPars->nTfiLevMax )
            printf( "TFI = %d. ",     pPars->nTfiLevMax );
        if ( pPars->nFanoutMax )
            printf( "FanMax = %d. ",  pPars->nFanoutMax );
        if ( pPars->nWinSizeMax )
            printf( "WinMax = %d. ",  pPars->nWinSizeMax );
        if ( pPars->nBTLimit )
            printf( "Confl = %d. ",   pPars->nBTLimit );
        if ( pPars->nMffcMin && pPars->fArea )
            printf( "MffcMin = %d. ", pPars->nMffcMin );
        if ( pPars->nMffcMax && pPars->fArea )
            printf( "MffcMax = %d. ", pPars->nMffcMax );
        if ( pPars->nDecMax )
            printf( "DecMax = %d. ",  pPars->nDecMax );
        if ( pPars->iNodeOne )
            printf( "Pivot = %d. ",   pPars->iNodeOne );
        if ( !pPars->fArea )
            printf( "Win = %d. ",     pPars->nTimeWin );
        if ( !pPars->fArea )
            printf( "Delta = %.2f ps. ", MIO_NUMINV*p->DeltaCrit );
        if ( pPars->fArea )
            printf( "0-cost = %s. ",  pPars->fZeroCost ? "yes" : "no" );
        printf( "Effort = %s. ",      pPars->fMoreEffort ? "yes" : "no" );
        printf( "Sim = %s. ",         pPars->fUseSim ? "yes" : "no" );
        printf( "\n" );
    }
    // preparation steps
    Abc_NtkLevel( pNtk );
    if ( p->pPars->fUseSim )
        Sfm_NtkSimulate( pNtk );
    // record statistics
    if ( pPars->fVerbose ) p->nTotalNodesBeg = Abc_NtkNodeNum(pNtk);
    if ( pPars->fVerbose ) p->nTotalEdgesBeg = Abc_NtkGetTotalFanins(pNtk);
    // perform optimization
    if ( pPars->fArea )
    {
        if ( pPars->fAreaRev )
            Abc_NtkAreaOpt2( p );
        else
            Abc_NtkAreaOpt( p );
    }
    else
        Abc_NtkDelayOpt( p );
    // record statistics
    if ( pPars->fVerbose ) p->nTotalNodesEnd = Abc_NtkNodeNum(pNtk);
    if ( pPars->fVerbose ) p->nTotalEdgesEnd = Abc_NtkGetTotalFanins(pNtk);
    // print stats and quit
    if ( pPars->fVerbose )
    Sfm_DecPrintStats( p );
    if ( pPars->fLibVerbose )
        Sfm_LibPrint( p->pLib );
    Sfm_DecStop( p );
}